

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall Assimp::FBX::FBXConverter::ConvertAnimations(FBXConverter *this)

{
  pointer ppAVar1;
  FrameRate fp;
  FileGlobalSettings *pFVar2;
  vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  *pvVar3;
  pointer ppAVar4;
  float fVar5;
  double dVar6;
  
  pFVar2 = Document::GlobalSettings(this->doc);
  fp = FileGlobalSettings::TimeMode(pFVar2);
  pFVar2 = Document::GlobalSettings(this->doc);
  fVar5 = FileGlobalSettings::CustomFrameRate(pFVar2);
  dVar6 = FrameRateToDouble(fp,(double)fVar5);
  this->anim_fps = dVar6;
  pvVar3 = Document::AnimationStacks(this->doc);
  ppAVar1 = (pvVar3->
            super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar4 = (pvVar3->
                 super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppAVar4 != ppAVar1;
      ppAVar4 = ppAVar4 + 1) {
    ConvertAnimationStack(this,*ppAVar4);
  }
  return;
}

Assistant:

void FBXConverter::ConvertAnimations()
        {
            // first of all determine framerate
            const FileGlobalSettings::FrameRate fps = doc.GlobalSettings().TimeMode();
            const float custom = doc.GlobalSettings().CustomFrameRate();
            anim_fps = FrameRateToDouble(fps, custom);

            const std::vector<const AnimationStack*>& animations = doc.AnimationStacks();
            for (const AnimationStack* stack : animations) {
                ConvertAnimationStack(*stack);
            }
        }